

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::BufferStorage::GetBufferParameterTest::GetBufferParameterTest
          (GetBufferParameterTest *this,Context *context)

{
  uint uVar1;
  testCase local_78;
  testCase local_70;
  testCase local_68;
  testCase local_60;
  testCase local_58;
  uint local_50;
  uint local_4c;
  GLenum access;
  GLuint access_idx;
  GLenum flags_with_mapping;
  GLenum flag_mapping_bits;
  GLuint flag_idx;
  testCase local_2c;
  uint local_24;
  uint local_20;
  GLuint client;
  GLuint dynamic;
  GLenum flags;
  Context *context_local;
  GetBufferParameterTest *this_local;
  
  _dynamic = context;
  context_local = (Context *)this;
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"get_buffer_parameter",
             "Test queries for parameters of buffers");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetBufferParameterTest_0322e288;
  std::
  vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    client = 0x100;
    if (local_20 == 0) {
      client = 0;
    }
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      uVar1 = 0x200;
      if (local_24 == 0) {
        uVar1 = 0;
      }
      client = uVar1 | client;
      if (client != 0) {
        testCase::testCase(&local_2c,client,0);
        std::
        vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
        ::push_back(&this->m_test_cases,&local_2c);
      }
      for (flags_with_mapping = 0; flags_with_mapping < 3;
          flags_with_mapping = flags_with_mapping + 1) {
        access_idx = GetBufferParameterTest::s_mapping_bits[flags_with_mapping];
        access = client | access_idx;
        for (local_4c = 0; local_4c <= flags_with_mapping; local_4c = local_4c + 1) {
          local_50 = GetBufferParameterTest::s_mapping_bits[local_4c];
          testCase::testCase(&local_58,access | 1,local_50 | 1);
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_58);
          testCase::testCase(&local_60,access | 2,local_50 | 2);
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_60);
          testCase::testCase(&local_68,access | 3,local_50 | 1);
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_68);
          testCase::testCase(&local_70,access | 3,local_50 | 2);
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_70);
          testCase::testCase(&local_78,access | 3,local_50 | 3);
          std::
          vector<gl4cts::BufferStorage::GetBufferParameterTest::testCase,_std::allocator<gl4cts::BufferStorage::GetBufferParameterTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_78);
        }
      }
    }
  }
  return;
}

Assistant:

GetBufferParameterTest::GetBufferParameterTest(deqp::Context& context)
	: TestCase(context, "get_buffer_parameter", "Test queries for parameters of buffers")
{
	static const GLenum s_mapping_bits[] = { 0, GL_MAP_PERSISTENT_BIT, GL_MAP_COHERENT_BIT | GL_MAP_PERSISTENT_BIT };
	static const GLuint s_n_mapping_bits = sizeof(s_mapping_bits) / sizeof(s_mapping_bits[0]);

	GLenum flags = 0;

	for (GLuint dynamic = 0; dynamic < 2; ++dynamic)
	{
		flags = (0 == dynamic) ? 0 : GL_DYNAMIC_STORAGE_BIT;

		for (GLuint client = 0; client < 2; ++client)
		{
			flags |= (0 == client) ? 0 : GL_CLIENT_STORAGE_BIT;

			/* No "map" bits */
			if (0 != flags)
			{
				m_test_cases.push_back(testCase(flags, 0));
			}

			for (GLuint flag_idx = 0; flag_idx < s_n_mapping_bits; ++flag_idx)
			{
				const GLenum flag_mapping_bits  = s_mapping_bits[flag_idx];
				const GLenum flags_with_mapping = flags | flag_mapping_bits;

				for (GLuint access_idx = 0; access_idx <= flag_idx; ++access_idx)
				{
					const GLenum access = s_mapping_bits[access_idx];

					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_READ_BIT));
					m_test_cases.push_back(
						testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT, access | GL_MAP_WRITE_BIT));
					m_test_cases.push_back(testCase(flags_with_mapping | GL_MAP_READ_BIT | GL_MAP_WRITE_BIT,
													access | GL_MAP_WRITE_BIT | GL_MAP_READ_BIT));
				}
			}
		}
	}
}